

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::leave(SPxSolverBase<double> *this,int leaveIdx,bool polish)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Verbosity VVar6;
  Representation RVar7;
  SSVectorBase<double> *pSVar8;
  int extraout_var;
  element_type *peVar9;
  double *pdVar10;
  SPxId *id;
  undefined4 extraout_var_00;
  Status *pSVar11;
  byte in_DL;
  uint in_ESI;
  SPxSolverBase<double> *in_RDI;
  Real RVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Desc *ds;
  SPxException *F;
  double newCoPrhs;
  double newLBbound;
  double newUBbound;
  double enterBound;
  Verbosity old_verbosity_4;
  double reject_treshold;
  SVectorBase<double> *newVector;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  SPxStatusException *E;
  Verbosity old_verbosity;
  SPxId enterId;
  double oldShift;
  double enterVal;
  StableSum<double> objChange;
  int leaveNum;
  double leavebound;
  double leaveMax;
  SPxId none;
  SPxId leaveId;
  Status leaveStat;
  bool instable;
  undefined8 in_stack_fffffffffffffcd8;
  SPxSolverBase<double> *this_00;
  SPxStatus SVar16;
  SVectorBase<double> *in_stack_fffffffffffffce0;
  SPxSolverBase<double> *this_01;
  SSVectorBase<double> *in_stack_fffffffffffffce8;
  SPxBasisBase<double> *in_stack_fffffffffffffcf0;
  SSVectorBase<double> *in_stack_fffffffffffffcf8;
  Item *pIVar17;
  SPxSolverBase<double> *in_stack_fffffffffffffd00;
  SSVectorBase<double> *in_stack_fffffffffffffd08;
  SPxBasisBase<double> *in_stack_fffffffffffffd10;
  double in_stack_fffffffffffffd18;
  SPxSolverBase<double> *in_stack_fffffffffffffd20;
  Item *pIVar18;
  SPxSolverBase<double> *in_stack_fffffffffffffd60;
  SPxSolverBase<double> *in_stack_fffffffffffffd70;
  SPxSolverBase<double> *in_stack_fffffffffffffd80;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  StableSum<double> local_128;
  DataKey local_118;
  StableSum<double> local_110;
  DataKey local_100;
  undefined4 local_f8;
  Verbosity local_f4;
  Real local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  Verbosity local_dc [19];
  undefined4 local_90;
  Verbosity local_8c;
  StableSum<double> local_88;
  DataKey local_78;
  DataKey local_70;
  double local_68;
  Item *local_60;
  undefined1 local_58 [20];
  undefined1 local_44 [12];
  Item *local_38;
  undefined1 local_2c [8];
  DataKey local_24;
  uint local_1c;
  byte local_16;
  byte local_15;
  uint local_14 [5];
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_15 = in_DL & 1;
  local_16 = in_RDI->instableLeave & 1;
  local_14[0] = in_ESI;
  pSVar8 = UpdateVector<double>::delta(in_RDI->theCoPvec);
  bVar3 = SSVectorBase<double>::isSetup(pSVar8);
  if (bVar3) {
    UpdateVector<double>::delta(in_RDI->theCoPvec);
    iVar4 = SSVectorBase<double>::size((SSVectorBase<double> *)0x276a8a);
    if (iVar4 == 0) {
      UpdateVector<double>::delta(in_RDI->theCoPvec);
      Array<soplex::UnitVectorBase<double>_>::operator[]
                ((Array<soplex::UnitVectorBase<double>_> *)in_stack_fffffffffffffce0,iVar5);
      SPxBasisBase<double>::coSolve
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
  }
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])();
  SPxId::SPxId((SPxId *)0x276b0e);
  SPxId::SPxId((SPxId *)0x276b1b);
  StableSum<double>::StableSum((StableSum<double> *)local_58);
  this_00 = (SPxSolverBase<double> *)local_44;
  this_01 = (SPxSolverBase<double> *)local_58;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7f])
            (in_RDI,(ulong)local_14[0],&local_1c,&local_24,&local_38,local_44 + 4);
  if (((local_15 & 1) == 0) && (in_RDI->m_maxCycle < in_RDI->m_numCycle)) {
    if ((double)local_38 <= 0.0) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8b])();
    }
    else {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8c])();
    }
    forceRecompNonbasicValue(in_RDI);
  }
  local_60 = local_38;
  in_RDI->boundflips = 0;
  local_68 = in_RDI->theShift;
  local_70.info =
       (*in_RDI->theratiotester->_vptr_SPxRatioTester[8])
                 (in_RDI->theratiotester,&local_60,(ulong)local_14[0],(ulong)(local_15 & 1));
  local_70.idx = extraout_var;
  tolerances(in_RDI);
  peVar9 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x276c7a);
  Tolerances::epsilon(peVar9);
  bVar3 = NE<double,double,double>((double)this_01,(double)this_00,1.2765213616852e-317);
  if (bVar3) {
    SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[77],_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n"
              );
    forceRecompNonbasicValue(in_RDI);
  }
  in_RDI->instableLeaveNum = -1;
  in_RDI->instableLeave = false;
  bVar3 = SPxId::isValid((SPxId *)&local_70);
  if (bVar3) {
    id = SPxBasisBase<double>::baseId((SPxBasisBase<double> *)this_01,(int)((ulong)this_00 >> 0x20))
    ;
    iVar5 = SPxId::operator!=((SPxId *)&local_70,id);
    if (iVar5 == 0) {
      SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
      (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&in_RDI->super_SPxBasisBase<double>,(ulong)local_14[0],local_2c,0);
      if (local_1c == 0xfffffffe) {
        bVar3 = SPxId::isSPxRowId((SPxId *)&local_24);
        iVar5 = (int)((ulong)this_00 >> 0x20);
        if (bVar3) {
          pSVar11 = SPxBasisBase<double>::Desc::rowStatus((Desc *)this_01,iVar5);
          *pSVar11 = P_ON_LOWER;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          dVar13 = *pdVar10;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          *pdVar10 = dVar13;
        }
        else {
          pSVar11 = SPxBasisBase<double>::Desc::colStatus((Desc *)this_01,iVar5);
          *pSVar11 = P_ON_LOWER;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          dVar13 = *pdVar10;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          *pdVar10 = dVar13;
        }
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
        *pdVar10 = 0.0;
        pdVar10 = (double *)infinity();
        dVar13 = *pdVar10;
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
        *pdVar10 = -dVar13;
      }
      else {
        bVar3 = SPxId::isSPxRowId((SPxId *)&local_24);
        iVar5 = (int)((ulong)this_00 >> 0x20);
        if (bVar3) {
          pSVar11 = SPxBasisBase<double>::Desc::rowStatus((Desc *)this_01,iVar5);
          *pSVar11 = P_ON_UPPER;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          dVar13 = *pdVar10;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          *pdVar10 = dVar13;
        }
        else {
          pSVar11 = SPxBasisBase<double>::Desc::colStatus((Desc *)this_01,iVar5);
          *pSVar11 = P_ON_UPPER;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          dVar13 = *pdVar10;
          pdVar10 = VectorBase<double>::operator[]
                              ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
          *pdVar10 = dVar13;
        }
        pdVar10 = (double *)infinity();
        dVar13 = *pdVar10;
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
        *pdVar10 = dVar13;
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
        *pdVar10 = 0.0;
      }
      pIVar18 = local_60;
      pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
      pIVar17 = local_60;
      *pdVar10 = (double)pIVar18;
      pdVar10 = UpdateVector<double>::value(in_RDI->thePvec);
      pIVar18 = local_60;
      *pdVar10 = (double)pIVar17;
      dVar13 = epsilon((SPxSolverBase<double> *)0x2784af);
      if ((dVar13 < (double)pIVar18) ||
         (pIVar17 = local_60, dVar13 = epsilon((SPxSolverBase<double> *)0x2784da),
         (double)pIVar17 < -dVar13)) {
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])();
      }
      pdVar10 = UpdateVector<double>::value(in_RDI->theFvec);
      *pdVar10 = 0.0;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      in_RDI->m_pricingViol = *pdVar10 + in_RDI->m_pricingViol;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      *pdVar10 = *pdVar10 * -1.0;
    }
    else {
      iVar5 = (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                .super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])
                        (in_RDI,&local_70);
      local_e8 = CONCAT44(extraout_var_00,iVar5);
      if ((in_RDI->solveVector2 == (SSVectorBase<double> *)0x0) ||
         (in_RDI->solveVector3 == (SSVectorBase<double> *)0x0)) {
        if (in_RDI->solveVector2 == (SSVectorBase<double> *)0x0) {
          if (in_RDI->solveVector3 == (SSVectorBase<double> *)0x0) {
            UpdateVector<double>::delta(in_RDI->theFvec);
            SPxBasisBase<double>::solve4update
                      (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                       (SVectorBase<double> *)this_01);
          }
          else {
            UpdateVector<double>::delta(in_RDI->theFvec);
            SPxBasisBase<double>::solve4update
                      ((SPxBasisBase<double> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                       (SSVectorBase<double> *)in_stack_fffffffffffffcf0,
                       (SVectorBase<double> *)in_stack_fffffffffffffce8,
                       (SSVectorBase<double> *)this_01);
            VectorBase<double>::operator-=
                      ((VectorBase<double> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[51],_int_&,_0>
                      (in_RDI,(char (*) [51])"ILBFRT02 breakpoints passed / bounds flipped = {}\n",
                       &in_RDI->boundflips);
            in_RDI->totalboundflips = in_RDI->boundflips + in_RDI->totalboundflips;
          }
        }
        else {
          UpdateVector<double>::delta(in_RDI->theFvec);
          SPxBasisBase<double>::solve4update
                    ((SPxBasisBase<double> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (SSVectorBase<double> *)in_stack_fffffffffffffcf0,
                     (SVectorBase<double> *)in_stack_fffffffffffffce8,
                     (SSVectorBase<double> *)this_01);
        }
      }
      else {
        UpdateVector<double>::delta(in_RDI->theFvec);
        this_00 = (SPxSolverBase<double> *)in_RDI->solveVector3rhs;
        SPxBasisBase<double>::solve4update
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   (SSVectorBase<double> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   (SVectorBase<double> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   (SSVectorBase<double> *)in_stack_fffffffffffffd20);
        VectorBase<double>::operator-=
                  ((VectorBase<double> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[51],_int_&,_0>
                  (in_RDI,(char (*) [51])"ILBFRT02 breakpoints passed / bounds flipped = {}\n",
                   &in_RDI->boundflips);
        in_RDI->totalboundflips = in_RDI->boundflips + in_RDI->totalboundflips;
      }
      tolerances(in_RDI);
      peVar9 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27771e);
      local_f0 = Tolerances::scaleAccordingToEpsilon(peVar9,1e-10);
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar13 = SSVectorBase<double>::operator[]
                         ((SSVectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      RVar12 = spxAbs<double>(dVar13);
      uVar1 = local_44._4_8_;
      if (RVar12 < local_f0) {
        if ((local_16 & 1) == 0) {
          UpdateVector<double>::delta(in_RDI->theFvec);
          iVar5 = (int)((ulong)this_00 >> 0x20);
          SSVectorBase<double>::clear((SSVectorBase<double> *)this_01);
          local_118 = local_24;
          (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                    (in_RDI,(ulong)(uint)local_44._0_4_,local_24,(ulong)local_1c,local_e8);
          (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                    (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_2c,0);
          StableSum<double>::StableSum(&local_128,0.0);
          local_58._0_8_ = local_128.sum;
          local_58._8_8_ = local_128.c;
          pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_01,iVar5);
          SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[56],_int_&,_double_&,_0>
                    (in_RDI,(char (*) [56])
                            "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n",
                     (int *)local_14,pdVar10);
          pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_01,iVar5);
          *pdVar10 = *pdVar10 * 0.01;
          return true;
        }
        if ((in_RDI->spxout != (SPxOut *)0x0) &&
           (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
          local_f4 = SPxOut::getVerbosity(in_RDI->spxout);
          local_f8 = 5;
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_f8);
          soplex::operator<<((SPxOut *)this_01,(char *)this_00);
          soplex::operator<<((SPxOut *)this_01,(char *)this_00);
          soplex::operator<<((SPxOut *)this_01,(_func_ostream_ptr_ostream_ptr *)this_00);
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_f4);
        }
        SVar16 = (SPxStatus)((ulong)this_00 >> 0x20);
        local_100 = local_24;
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                  (in_RDI,(ulong)(uint)local_44._0_4_,local_24,(ulong)local_1c,0);
        (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_2c,0);
        StableSum<double>::StableSum(&local_110,0.0);
        local_58._0_8_ = local_110.sum;
        local_58._8_8_ = local_110.c;
        RVar7 = rep(in_RDI);
        if (RVar7 == ROW) {
          computePrimalray4Row(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          setBasisStatus(this_01,SVar16);
        }
        else {
          computeDualfarkas4Col(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          setBasisStatus(this_01,SVar16);
        }
        return false;
      }
      dVar13 = epsilon((SPxSolverBase<double> *)0x277ab0);
      uVar2 = local_44._4_8_;
      iVar5 = (int)((ulong)this_00 >> 0x20);
      if ((dVar13 < (double)uVar1) ||
         (dVar13 = epsilon((SPxSolverBase<double> *)0x277ae1), (double)uVar2 < -dVar13)) {
        local_130 = -(double)local_44._4_8_;
        SPxBasisBase<double>::baseVec((SPxBasisBase<double> *)this_01,iVar5);
        VectorBase<double>::multAdd<double,double>
                  ((VectorBase<double> *)in_stack_fffffffffffffd00,
                   (double *)in_stack_fffffffffffffcf8,
                   (SVectorBase<double> *)in_stack_fffffffffffffcf0);
      }
      this_00 = (SPxSolverBase<double> *)local_58;
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x80])
                (local_38,in_RDI,local_70,&local_138,&local_140,&local_148,&local_150);
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      *pdVar10 = local_140;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      *pdVar10 = local_148;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      dVar13 = local_138;
      *pdVar10 = local_150;
      dVar14 = epsilon((SPxSolverBase<double> *)0x277e09);
      dVar15 = local_138;
      if ((dVar14 < dVar13) ||
         (dVar13 = epsilon((SPxSolverBase<double> *)0x277e3a), dVar15 < -dVar13)) {
        VectorBase<double>::multAdd<double,double>
                  ((VectorBase<double> *)in_stack_fffffffffffffd00,
                   (double *)in_stack_fffffffffffffcf8,
                   (SVectorBase<double> *)in_stack_fffffffffffffcf0);
      }
      pIVar17 = local_60;
      pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
      pIVar18 = local_60;
      *pdVar10 = (double)pIVar17;
      pdVar10 = UpdateVector<double>::value(in_RDI->thePvec);
      pIVar17 = local_60;
      *pdVar10 = (double)pIVar18;
      dVar13 = epsilon((SPxSolverBase<double> *)0x277f0c);
      pIVar18 = local_60;
      if ((dVar13 < (double)pIVar17) ||
         (dVar13 = epsilon((SPxSolverBase<double> *)0x277f3d), (double)pIVar18 < -dVar13)) {
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])();
      }
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      dVar13 = *pdVar10;
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar15 = SSVectorBase<double>::operator[]
                         ((SSVectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      dVar15 = -(dVar13 - (double)local_44._4_8_) / dVar15;
      pdVar10 = UpdateVector<double>::value(in_RDI->theFvec);
      *pdVar10 = dVar15;
      UpdateVector<double>::update((UpdateVector<double> *)0x278033);
      pdVar10 = UpdateVector<double>::value(in_RDI->theFvec);
      dVar13 = local_138 - *pdVar10;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      *pdVar10 = dVar13;
      updateFtest(in_stack_fffffffffffffd60);
      StableSum::operator_cast_to_double((StableSum *)local_58);
      updateNonbasicValue(in_stack_fffffffffffffd00,(double)in_stack_fffffffffffffcf8);
      uVar1 = local_e8;
      pSVar8 = UpdateVector<double>::delta(in_RDI->theFvec);
      (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&in_RDI->super_SPxBasisBase<double>,(ulong)local_14[0],&local_70,uVar1,pSVar8);
    }
    pIVar17 = local_38;
    dVar13 = entertol(this_00);
    if (((dVar13 < (double)pIVar17) &&
        (pIVar17 = local_60, dVar13 = entertol(this_00), (double)pIVar17 <= dVar13)) ||
       ((dVar13 = entertol(this_00), (double)local_38 < -dVar13 &&
        (pIVar17 = local_60, dVar13 = entertol(this_00), -dVar13 <= (double)pIVar17)))) {
      iVar5 = (int)((ulong)this_00 >> 0x20);
      pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_01,iVar5);
      dVar13 = *pdVar10;
      pdVar10 = (double *)infinity();
      if (*pdVar10 <= dVar13) {
        pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_01,iVar5);
        dVar13 = *pdVar10;
        pdVar10 = (double *)infinity();
        if (dVar13 <= -*pdVar10) {
          return true;
        }
      }
      if ((local_1c != 0xffffffff) && (local_1c != 1)) {
        in_RDI->m_numCycle = in_RDI->m_numCycle + 1;
        in_RDI->leaveCycles = in_RDI->leaveCycles + 1;
      }
    }
    else {
      in_RDI->m_numCycle = in_RDI->m_numCycle / 2;
    }
    return true;
  }
  local_78 = local_24;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
            (in_RDI,(ulong)(uint)local_44._0_4_,local_24,(ulong)local_1c,0);
  (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
            (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_2c,0);
  StableSum<double>::StableSum(&local_88,0.0);
  local_58._0_8_ = local_88.sum;
  local_58._8_8_ = local_88.c;
  if ((local_15 & 1) != 0) {
    return false;
  }
  tolerances(in_RDI);
  peVar9 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x276ddb);
  Tolerances::epsilon(peVar9);
  bVar3 = NE<double,double,double>((double)this_01,(double)this_00,1.27669576685818e-317);
  if (bVar3) {
    pdVar10 = VectorBase<double>::operator[]
                        ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
    SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[56],_int_&,_double_&,_0>
              (in_RDI,(char (*) [56])"DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n",
               (int *)local_14,pdVar10);
    if ((local_16 & 1) == 0) {
      in_RDI->instableLeaveNum = local_14[0];
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      in_RDI->instableLeaveVal = *pdVar10;
      dVar13 = in_RDI->instableLeaveVal;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      *pdVar10 = dVar13 / 10.0;
      return true;
    }
  }
  iVar5 = SPxBasisBase<double>::lastUpdate(&in_RDI->super_SPxBasisBase<double>);
  if (iVar5 < 2) {
    if ((in_RDI->recomputedVectors & 1U) == 0) {
      RVar12 = spxAbs<double>((Real)local_60);
      dVar13 = leavetol(this_00);
      if (RVar12 < dVar13) {
        if ((in_RDI->spxout != (SPxOut *)0x0) &&
           (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
          local_dc[2] = SPxOut::getVerbosity(in_RDI->spxout);
          local_dc[1] = 5;
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_dc + 1);
          soplex::operator<<((SPxOut *)this_01,(char *)this_00);
          soplex::operator<<((SPxOut *)this_01,(_func_ostream_ptr_ostream_ptr *)this_00);
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_dc + 2);
        }
        computeFrhs(in_stack_fffffffffffffd80);
        SPxBasisBase<double>::solve
                  (in_stack_fffffffffffffcf0,(VectorBase<double> *)in_stack_fffffffffffffce8,
                   (VectorBase<double> *)this_01);
        computeFtest(in_stack_fffffffffffffd70);
        in_RDI->recomputedVectors = true;
        return true;
      }
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
      local_dc[0] = SPxOut::getVerbosity(in_RDI->spxout);
      local_e0 = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_e0);
      soplex::operator<<((SPxOut *)this_01,(char *)this_00);
      soplex::operator<<((SPxOut *)this_01,(char *)this_00);
      soplex::operator<<((SPxOut *)this_01,(_func_ostream_ptr_ostream_ptr *)this_00);
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_dc);
    }
    SVar16 = (SPxStatus)((ulong)this_00 >> 0x20);
    RVar7 = rep(in_RDI);
    if (RVar7 == COLUMN) {
      computeDualfarkas4Col(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      setBasisStatus(this_01,SVar16);
    }
    else {
      computePrimalray4Row(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      setBasisStatus(this_01,SVar16);
    }
    return false;
  }
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
    local_8c = SPxOut::getVerbosity(in_RDI->spxout);
    local_90 = 5;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_90);
    soplex::operator<<((SPxOut *)this_01,(char *)this_00);
    soplex::operator<<((SPxOut *)this_01,(char *)this_00);
    soplex::operator<<((SPxOut *)this_01,(_func_ostream_ptr_ostream_ptr *)this_00);
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_8c);
  }
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])();
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}